

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent_coop.cpp
# Opt level: O0

void __thiscall
so_5::coop_t::do_deregistration_specific_actions(coop_t *this,coop_dereg_reason_t dereg_reason)

{
  coop_t *this_local;
  coop_dereg_reason_t dereg_reason_local;
  
  (this->m_dereg_reason).m_reason = dereg_reason.m_reason;
  shutdown_all_agents(this);
  decrement_usage_count(this);
  return;
}

Assistant:

void
coop_t::do_deregistration_specific_actions(
	coop_dereg_reason_t dereg_reason )
{
	m_dereg_reason = std::move( dereg_reason );

	shutdown_all_agents();

	// Reference count could decremented.
	// If coop was an empty coop then this action initiates the whole
	// coop deregistration.
	decrement_usage_count();
}